

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O3

Type __thiscall UnifiedRegex::RegexPattern::EnsureTestCache(RegexPattern *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this_00;
  undefined4 *puVar4;
  char *pcVar5;
  long in_RSI;
  long *addr;
  _func_int **pp_Var6;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pp_Var6 = *(_func_int ***)(in_RSI + 8);
  if (pp_Var6 == (_func_int **)0x0) {
    local_50 = (undefined1  [8])&RegExpTestCache::typeinfo;
    data.typeinfo = (type_info *)0x40;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_a8420d7;
    data.filename._0_4_ = 0x97;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (*(Recycler **)(*(long *)(in_RSI + 0x10) + 0x4e8),(TrackAllocData *)local_50
                        );
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00edf195;
      *puVar4 = 0;
    }
    pcVar5 = Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                       (this_00,0x48);
    if (pcVar5 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00edf195:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    addr = (long *)(in_RSI + 8);
    pcVar5[0] = '\0';
    pcVar5[1] = '\0';
    pcVar5[2] = '\0';
    pcVar5[3] = '\0';
    pcVar5[4] = '\0';
    pcVar5[5] = '\0';
    pcVar5[6] = '\0';
    pcVar5[7] = '\0';
    Memory::Recycler::WBSetBit((char *)addr);
    *addr = (long)pcVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pp_Var6 = (_func_int **)*addr;
  }
  Memory::Recycler::WBSetBit((char *)this);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       pp_Var6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  return (Type)(RegExpTestCache *)this;
}

Assistant:

RegexPattern::EnsureTestCache()
    {
        if (this->testCache == nullptr)
        {
            this->testCache = RecyclerNewPlusZ(this->library->GetRecycler(), TestCacheSize * sizeof(void*), RegExpTestCache);
        }
        return this->testCache;
    }